

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

linkedMoveList parseMoveString(string *movesList)

{
  bool bVar1;
  char *moveString;
  string local_d8 [32];
  string local_b8 [36];
  move local_94;
  string local_90 [32];
  string local_70 [33];
  undefined2 local_4f;
  byte local_4d;
  string local_40 [8];
  string editList;
  string *movesList_local;
  linkedMoveList returnList;
  
  linkedMoveList::linkedMoveList((linkedMoveList *)&movesList_local);
  std::__cxx11::string::string(local_40,(string *)movesList);
  while( true ) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"");
    if (!bVar1) break;
    std::__cxx11::string::string(local_90,local_40);
    getFirstToken(local_70);
    moveString = (char *)std::__cxx11::string::c_str();
    local_94 = algebraicToMove(moveString);
    local_4f = local_94._0_2_;
    local_4d = local_94.special;
    linkedMoveList::add((linkedMoveList *)&movesList_local,local_94);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::string(local_d8,local_40);
    removeFirstToken(local_b8);
    std::__cxx11::string::operator=(local_40,(string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string(local_d8);
  }
  std::__cxx11::string::~string(local_40);
  return _movesList_local;
}

Assistant:

linkedMoveList parseMoveString(std::string movesList) {
  linkedMoveList returnList;
  std::string editList = movesList;
  while(editList != "") {
    returnList.add(algebraicToMove(getFirstToken(editList).c_str()));
    editList = removeFirstToken(editList);
  }
  return returnList;
}